

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Entity_State_PDU::Entity_State_PDU(Entity_State_PDU *this,Entity_State_PDU *ESPDU)

{
  DeadReckoningCalculator *local_b0;
  Entity_State_PDU *ESPDU_local;
  Entity_State_PDU *this_local;
  
  Header7::Header7(&this->super_Header,&ESPDU->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Entity_State_PDU_0032f050;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EntityID,&ESPDU->m_EntityID);
  this->m_ui8ForceID = ESPDU->m_ui8ForceID;
  this->m_ui8NumOfVariableParams = ESPDU->m_ui8NumOfVariableParams;
  DATA_TYPE::EntityType::EntityType(&this->m_EntityType,&ESPDU->m_EntityType);
  DATA_TYPE::EntityType::EntityType(&this->m_AltEntityType,&ESPDU->m_AltEntityType);
  DATA_TYPE::Vector::Vector(&this->m_EntityLinearVelocity,&ESPDU->m_EntityLinearVelocity);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_EntityLocation,&ESPDU->m_EntityLocation);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_EntityOrientation,&ESPDU->m_EntityOrientation);
  DATA_TYPE::EntityAppearance::EntityAppearance
            (&this->m_EntityAppearance,&ESPDU->m_EntityAppearance);
  DATA_TYPE::DeadReckoningParameter::DeadReckoningParameter
            (&this->m_DeadReckoningParameter,&ESPDU->m_DeadReckoningParameter);
  DATA_TYPE::EntityMarking::EntityMarking(&this->m_EntityMarking,&ESPDU->m_EntityMarking);
  DATA_TYPE::EntityCapabilities::EntityCapabilities
            (&this->m_EntityCapabilities,&ESPDU->m_EntityCapabilities);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::vector(&this->m_vVariableParameters,&ESPDU->m_vVariableParameters);
  if (ESPDU->m_pDrCalc == (DeadReckoningCalculator *)0x0) {
    local_b0 = (DeadReckoningCalculator *)0x0;
  }
  else {
    local_b0 = (DeadReckoningCalculator *)operator_new(0x170);
    UTILS::DeadReckoningCalculator::DeadReckoningCalculator(local_b0,ESPDU->m_pDrCalc);
  }
  this->m_pDrCalc = local_b0;
  return;
}

Assistant:

Entity_State_PDU::Entity_State_PDU( const Entity_State_PDU & ESPDU ) :
    Header( ESPDU ),
    m_EntityID( ESPDU.m_EntityID ),
    m_ui8ForceID( ESPDU.m_ui8ForceID ),
    m_ui8NumOfVariableParams( ESPDU.m_ui8NumOfVariableParams ),
    m_EntityType( ESPDU.m_EntityType ),
    m_AltEntityType( ESPDU.m_AltEntityType ),
    m_EntityLinearVelocity( ESPDU.m_EntityLinearVelocity ),
    m_EntityLocation( ESPDU.m_EntityLocation ),
    m_EntityOrientation( ESPDU.m_EntityOrientation ),
    m_EntityAppearance( ESPDU.m_EntityAppearance ),
    m_DeadReckoningParameter( ESPDU.m_DeadReckoningParameter ),
    m_EntityMarking( ESPDU.m_EntityMarking ),
    m_EntityCapabilities( ESPDU.m_EntityCapabilities ),
    m_vVariableParameters( ESPDU.m_vVariableParameters ),
    m_pDrCalc( ESPDU.m_pDrCalc ? new DeadReckoningCalculator( *ESPDU.m_pDrCalc ) : NULL )
{
}